

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O3

UBool changesWhenNFKC_Casefolded(BinaryProperty *param_1,UChar32 c,UProperty param_3)

{
  UBool UVar1;
  int iVar2;
  undefined4 uVar3;
  Normalizer2Impl *this;
  byte bVar4;
  bool bVar5;
  UErrorCode errorCode;
  UnicodeString src;
  UnicodeString dest;
  ReorderingBuffer buffer;
  UErrorCode local_dc;
  UnicodeString local_d8;
  UnicodeString local_98;
  ReorderingBuffer local_58;
  
  local_dc = U_ZERO_ERROR;
  this = icu_63::Normalizer2Factory::getNFKC_CFImpl(&local_dc);
  if (local_dc < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::UnicodeString::UnicodeString(&local_d8,c);
    local_58.str = &local_98;
    local_98.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
    local_98.fUnion.fStackFields.fLengthAndFlags = 2;
    local_58.start = (UChar *)0x0;
    local_58.reorderStart._0_5_ = 0;
    local_58.reorderStart._5_3_ = 0;
    local_58.limit._0_5_ = 0;
    local_58._37_8_ = 0;
    local_58.impl = this;
    iVar2 = icu_63::ReorderingBuffer::init(&local_58,(EVP_PKEY_CTX *)0x5);
    if ((char)iVar2 != '\0') {
      if ((local_d8.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
        if ((local_d8.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          local_d8.fUnion.fFields.fArray = local_d8.fUnion.fStackFields.fBuffer;
        }
      }
      else {
        local_d8.fUnion.fFields.fArray = (char16_t *)0x0;
      }
      uVar3 = local_d8.fUnion.fFields.fLength;
      if (-1 < local_d8.fUnion.fStackFields.fLengthAndFlags) {
        uVar3 = (int)local_d8.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      icu_63::Normalizer2Impl::compose
                (this,local_d8.fUnion.fFields.fArray,
                 (char16_t *)((long)local_d8.fUnion.fFields.fArray + (long)(int)uVar3 * 2),'\0',
                 '\x01',&local_58,&local_dc);
    }
    icu_63::ReorderingBuffer::~ReorderingBuffer(&local_58);
    if (local_dc < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((local_98.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        if (-1 < local_98.fUnion.fStackFields.fLengthAndFlags) {
          local_98.fUnion.fFields.fLength = (int)local_98.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (-1 < local_d8.fUnion.fStackFields.fLengthAndFlags) {
          local_d8.fUnion.fFields.fLength = (int)local_d8.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        bVar5 = false;
        if ((((int)local_d8.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
           (bVar5 = false, local_98.fUnion.fFields.fLength == local_d8.fUnion.fFields.fLength)) {
          UVar1 = icu_63::UnicodeString::doEquals
                            (&local_98,&local_d8,local_98.fUnion.fFields.fLength);
          bVar5 = UVar1 != '\0';
        }
      }
      else {
        bVar5 = (bool)(local_d8.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
      }
      bVar4 = bVar5 ^ 1;
    }
    else {
      bVar4 = 0;
    }
    icu_63::UnicodeString::~UnicodeString(&local_98);
    icu_63::UnicodeString::~UnicodeString(&local_d8);
  }
  else {
    bVar4 = 0;
  }
  return bVar4;
}

Assistant:

static UBool changesWhenNFKC_Casefolded(const BinaryProperty &/*prop*/, UChar32 c, UProperty /*which*/) {
    UErrorCode errorCode=U_ZERO_ERROR;
    const Normalizer2Impl *kcf=Normalizer2Factory::getNFKC_CFImpl(errorCode);
    if(U_FAILURE(errorCode)) {
        return FALSE;
    }
    UnicodeString src(c);
    UnicodeString dest;
    {
        // The ReorderingBuffer must be in a block because its destructor
        // needs to release dest's buffer before we look at its contents.
        ReorderingBuffer buffer(*kcf, dest);
        // Small destCapacity for NFKC_CF(c).
        if(buffer.init(5, errorCode)) {
            const UChar *srcArray=src.getBuffer();
            kcf->compose(srcArray, srcArray+src.length(), FALSE,
                          TRUE, buffer, errorCode);
        }
    }
    return U_SUCCESS(errorCode) && dest!=src;
}